

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.h
# Opt level: O0

void __thiscall Am_Symbol_Table::Add_Item(Am_Symbol_Table *this,int value,char *key)

{
  char *key_local;
  int value_local;
  Am_Symbol_Table *this_local;
  
  OpenAmulet::Map<const_char_*,_int,_lex_less<const_char_*>_>::SetAt
            (&this->Am_Map_CStr2Int,key,value);
  OpenAmulet::Map<int,_const_char_*,_std::less<int>_>::SetAt(&this->Am_Map_CInt2Str,value,key);
  return;
}

Assistant:

void Add_Item(int value, const char *key)
  {
#ifdef OA_VERSION
    Am_Map_CStr2Int.SetAt(key, value);
    Am_Map_CInt2Str.SetAt(value, key);
#else
    SetAt(key, value);
#endif
  }